

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Matrix<float,_3,_3>_> __thiscall
vkt::shaderexecutor::exprP<tcu::Matrix<float,3,3>>
          (shaderexecutor *this,Expr<tcu::Matrix<float,_3,_3>_> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Matrix<float,_3,_3>_> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_> local_20;
  
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>::SharedPtr
            (&local_20,ptr);
  exprP<tcu::Matrix<float,3,3>>(this,&local_20);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>::release(&local_20);
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_3,_3>_> *)this;
  return (ExprP<tcu::Matrix<float,_3,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}